

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
mxx::impl::
split<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,impl *this,
          pair<int,_int> *begin,comm *end,comm *param_5)

{
  bool bVar1;
  int iVar2;
  uint comm_size;
  uint comm_rank;
  size_type sVar3;
  size_t global_size;
  const_reference pvVar4;
  const_reference __y;
  difference_type dVar5;
  reference pvVar6;
  unsigned_long uVar7;
  size_t sVar8;
  unsigned_long *puVar9;
  iterator __first;
  iterator __last;
  ulong uVar10;
  pair<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  pVar11;
  byte local_1a9;
  size_t out_size;
  unsigned_long local_130;
  size_t out_size_1;
  unsigned_long uStack_120;
  uint j;
  size_t eq_size_split;
  pair<int,_int> *local_110;
  unsigned_long local_108;
  size_t eq_size;
  size_t local_f8;
  pair<int,_int> *local_e8;
  size_t local_e0;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_d8;
  pair<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  eqr;
  ulong uStack_c0;
  uint split_by;
  size_t i;
  blk_dist local_part;
  size_t local_size;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  pos;
  allocator<unsigned_long> local_49;
  value_type_conflict2 local_48;
  byte local_39;
  comm *local_38;
  comm *comm_local;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *splitters_local;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  local_20;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  end_local;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  begin_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *send_counts;
  
  local_38 = param_5;
  comm_local = end;
  local_20._M_current = begin;
  end_local._M_current = (pair<int,_int> *)this;
  sVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)end);
  iVar2 = mxx::comm::size(local_38);
  if (sVar3 != (long)iVar2 - 1U) {
    assert_fail("splitters.size() == (size_t)comm.size() - 1",
                "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/samplesort.hpp"
                ,0xc3,"split");
  }
  local_39 = 0;
  iVar2 = mxx::comm::size(local_38);
  local_48 = 0;
  std::allocator<unsigned_long>::allocator(&local_49);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,(long)iVar2,&local_48,&local_49);
  std::allocator<unsigned_long>::~allocator(&local_49);
  local_size = (size_t)end_local._M_current;
  local_part.div1mod = (size_t)local_20._M_current;
  global_size = std::
                distance<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                          (end_local,local_20);
  comm_size = mxx::comm::size(local_38);
  comm_rank = mxx::comm::rank(local_38);
  blk_dist_buf::blk_dist_buf((blk_dist_buf *)&i,global_size,comm_size,comm_rank);
  uStack_c0 = 0;
  while( true ) {
    sVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                      ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                       comm_local);
    if (sVar3 <= uStack_c0) break;
    eqr.second._M_current._4_4_ = 1;
    while( true ) {
      uVar10 = (ulong)eqr.second._M_current._4_4_;
      sVar3 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::size
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         comm_local);
      local_1a9 = 0;
      if (uStack_c0 + uVar10 < sVar3) {
        pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                           ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                            comm_local,uStack_c0);
        __y = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                        ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                         comm_local,uStack_c0 + eqr.second._M_current._4_4_);
        bVar1 = std::less<std::pair<int,_int>_>::operator()
                          ((less<std::pair<int,_int>_> *)((long)&splitters_local + 7),pvVar4,__y);
        local_1a9 = bVar1 ^ 0xff;
      }
      if ((local_1a9 & 1) == 0) break;
      eqr.second._M_current._4_4_ = eqr.second._M_current._4_4_ + 1;
    }
    local_e0 = local_size;
    local_e8 = local_20._M_current;
    pvVar4 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::operator[]
                       ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        comm_local,uStack_c0);
    pVar11 = std::
             equal_range<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::pair<int,int>,std::less<std::pair<int,int>>>
                       (local_e0,local_e8,pvVar4);
    eqr.first = pVar11.second._M_current;
    eq_size = (size_t)pVar11.first._M_current;
    local_f8 = local_size;
    local_d8._M_current = (pair<int,_int> *)eq_size;
    dVar5 = std::
            distance<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                      ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        )local_size,
                       (__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                        )eq_size);
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (__return_storage_ptr__,uStack_c0);
    *pvVar6 = *pvVar6 + dVar5;
    local_110 = local_d8._M_current;
    eq_size_split = (size_t)eqr.first._M_current;
    uVar7 = std::
            distance<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                      (local_d8,eqr.first);
    local_108 = uVar7;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (__return_storage_ptr__,uStack_c0);
    uStack_120 = (uVar7 + *pvVar6) / (ulong)(eqr.second._M_current._4_4_ + 1) + 1;
    for (out_size_1._4_4_ = 0; uVar7 = local_108, out_size_1._4_4_ < eqr.second._M_current._4_4_;
        out_size_1._4_4_ = out_size_1._4_4_ + 1) {
      local_130 = 0;
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (__return_storage_ptr__,uStack_c0 + out_size_1._4_4_);
      uVar10 = *pvVar6;
      sVar8 = blk_dist_buf::local_size((blk_dist_buf *)&i,(int)uStack_c0 + out_size_1._4_4_);
      if (uVar10 < sVar8) {
        sVar8 = blk_dist_buf::local_size((blk_dist_buf *)&i,(int)uStack_c0 + out_size_1._4_4_);
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (__return_storage_ptr__,uStack_c0 + out_size_1._4_4_);
        out_size = sVar8 - *pvVar6;
        puVar9 = std::max<unsigned_long>(&out_size,&stack0xfffffffffffffee0);
        puVar9 = std::min<unsigned_long>(puVar9,&local_108);
        local_130 = *puVar9;
        local_108 = local_108 - local_130;
      }
      uVar7 = local_130;
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (__return_storage_ptr__,uStack_c0 + out_size_1._4_4_);
      *pvVar6 = uVar7 + *pvVar6;
    }
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (__return_storage_ptr__,uStack_c0 + eqr.second._M_current._4_4_);
    *pvVar6 = uVar7 + *pvVar6;
    uStack_c0 = eqr.second._M_current._4_4_ + uStack_c0;
    local_size = (size_t)eqr.first._M_current;
  }
  dVar5 = std::
          distance<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
                    ((__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                      )local_size,local_20);
  iVar2 = mxx::comm::size(local_38);
  pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (__return_storage_ptr__,(long)(iVar2 + -1));
  *pvVar6 = dVar5 + *pvVar6;
  __first = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                      (__return_storage_ptr__);
  __last = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(__return_storage_ptr__);
  uVar7 = std::
          accumulate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                    ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )__first._M_current,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )__last._M_current,0);
  if (uVar7 != global_size) {
    assert_fail("std::accumulate(send_counts.begin(), send_counts.end(), static_cast<size_t>(0)) == local_size"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/samplesort.hpp"
                ,0xec,"split");
  }
  local_39 = 1;
  blk_dist_buf::~blk_dist_buf((blk_dist_buf *)&i);
  if ((local_39 & 1) == 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<size_t> split(_Iterator begin, _Iterator end, _Compare comp, const std::vector<typename std::iterator_traits<_Iterator>::value_type>& splitters, const mxx::comm& comm) {
    // 5. locally find splitter positions in data
    //    (if an identical splitter appears at least three times (or more),
    //    then split the intermediary buckets evenly) => send_counts
    MXX_ASSERT(splitters.size() == (size_t)comm.size() - 1);
    std::vector<size_t> send_counts(comm.size(), 0);
    _Iterator pos = begin;
    size_t local_size = std::distance(begin, end);
    blk_dist local_part(local_size, comm.size(), comm.rank());
    for (size_t i = 0; i < splitters.size();) {
        // get the number of splitters which are equal starting from `i`
        unsigned int split_by = 1;
        while (i+split_by < splitters.size()
               && !comp(splitters[i], splitters[i+split_by])) {
            ++split_by;
        }

        // get the range of equal elements
        std::pair<_Iterator, _Iterator> eqr = std::equal_range(pos, end, splitters[i], comp);

        // assign smaller elements to processor left of splitter (= `i`)
        send_counts[i] += std::distance(pos, eqr.first);
        pos = eqr.first;

        // split equal elements fairly across processors
        size_t eq_size = std::distance(pos, eqr.second);
        // try to split approx equal:
        size_t eq_size_split = (eq_size + send_counts[i]) / (split_by+1) + 1;
        for (unsigned int j = 0; j < split_by; ++j) {
            size_t out_size = 0;
            if (send_counts[i+j] < local_part.local_size(i+j)) {
                // try to distribute fairly
                out_size = std::min(std::max(local_part.local_size(i+j) - send_counts[i+j], eq_size_split), eq_size);
                eq_size -= out_size;
            }
            send_counts[i+j] += out_size;
        }
        // assign remaining elements to next processor
        send_counts[i+split_by] += eq_size;
        i += split_by;
        pos = eqr.second;
    }
    // send last elements to last processor
    size_t out_size = std::distance(pos, end);
    send_counts[comm.size() - 1] += out_size;
    MXX_ASSERT(std::accumulate(send_counts.begin(), send_counts.end(), static_cast<size_t>(0)) == local_size);
    return send_counts;
}